

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::FileDescriptorProto::_InternalSerialize
          (FileDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  string *psVar3;
  size_t __n;
  FileOptions *this_00;
  SourceCodeInfo *this_01;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  Type *s;
  Type *this_02;
  Type *this_03;
  Type *this_04;
  Type *this_05;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  uint8 *puVar12;
  uint8 *puVar13;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.name");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar3 = (this->package_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.package");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,(this->package_).ptr_,target)
    ;
  }
  iVar2 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar11 = 0;
    do {
      s = internal::RepeatedPtrFieldBase::
          Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (&(this->dependency_).super_RepeatedPtrFieldBase,iVar11);
      internal::WireFormatLite::VerifyUtf8String
                ((s->_M_dataplus)._M_p,(int)s->_M_string_length,SERIALIZE,
                 "google.protobuf.FileDescriptorProto.dependency");
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\x1a';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,3,s,target);
      }
      iVar11 = iVar11 + 1;
    } while (iVar2 != iVar11);
  }
  iVar2 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                          (&(this->message_type_).super_RepeatedPtrFieldBase,iVar11);
      *target = '\"';
      uVar10 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)(uVar10 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar10 = uVar10 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar10 | 0x80;
            uVar6 = uVar10 >> 7;
            puVar12 = puVar13 + 1;
            bVar5 = 0x3fff < uVar10;
            uVar10 = uVar6;
          } while (bVar5);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = DescriptorProto::_InternalSerialize(this_02,puVar12,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_03 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                          (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar11);
      *target = '*';
      uVar10 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)(uVar10 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar10 = uVar10 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar10 | 0x80;
            uVar6 = uVar10 >> 7;
            puVar12 = puVar13 + 1;
            bVar5 = 0x3fff < uVar10;
            uVar10 = uVar6;
          } while (bVar5);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = EnumDescriptorProto::_InternalSerialize(this_03,puVar12,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  iVar2 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_04 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
                          (&(this->service_).super_RepeatedPtrFieldBase,iVar11);
      *target = '2';
      uVar10 = (this_04->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)(uVar10 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar10 = uVar10 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar10 | 0x80;
            uVar6 = uVar10 >> 7;
            puVar12 = puVar13 + 1;
            bVar5 = 0x3fff < uVar10;
            uVar10 = uVar6;
          } while (bVar5);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = ServiceDescriptorProto::_InternalSerialize(this_04,puVar12,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_05 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                          (&(this->extension_).super_RepeatedPtrFieldBase,iVar11);
      *target = ':';
      uVar10 = (this_05->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        puVar12 = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)(uVar10 >> 7);
          puVar12 = target + 3;
        }
        else {
          puVar12 = target + 3;
          uVar10 = uVar10 >> 7;
          do {
            puVar13 = puVar12;
            puVar13[-1] = (byte)uVar10 | 0x80;
            uVar6 = uVar10 >> 7;
            puVar12 = puVar13 + 1;
            bVar5 = 0x3fff < uVar10;
            uVar10 = uVar6;
          } while (bVar5);
          *puVar13 = (uint8)uVar6;
        }
      }
      target = FieldDescriptorProto::_InternalSerialize(this_05,puVar12,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  if ((uVar1 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = this->options_;
    *target = 'B';
    uVar10 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar10 < 0x80) {
      target[1] = (byte)uVar10;
      puVar12 = target + 2;
    }
    else {
      target[1] = (byte)uVar10 | 0x80;
      if (uVar10 < 0x4000) {
        target[2] = (uint8)(uVar10 >> 7);
        puVar12 = target + 3;
      }
      else {
        puVar12 = target + 3;
        uVar10 = uVar10 >> 7;
        do {
          puVar13 = puVar12;
          puVar13[-1] = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          puVar12 = puVar13 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar5);
        *puVar13 = (uint8)uVar6;
      }
    }
    target = FileOptions::_InternalSerialize(this_00,puVar12,stream);
  }
  if ((uVar1 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->source_code_info_;
    *target = 'J';
    uVar10 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar10 < 0x80) {
      target[1] = (byte)uVar10;
      puVar12 = target + 2;
    }
    else {
      target[1] = (byte)uVar10 | 0x80;
      if (uVar10 < 0x4000) {
        target[2] = (uint8)(uVar10 >> 7);
        puVar12 = target + 3;
      }
      else {
        puVar12 = target + 3;
        uVar10 = uVar10 >> 7;
        do {
          puVar13 = puVar12;
          puVar13[-1] = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          puVar12 = puVar13 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar5);
        *puVar13 = (uint8)uVar6;
      }
    }
    target = SourceCodeInfo::_InternalSerialize(this_01,puVar12,stream);
  }
  iVar2 = (this->public_dependency_).current_size_;
  if (0 < iVar2) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar7 = (uint *)RepeatedField<int>::Get(&this->public_dependency_,iVar11);
      uVar10 = *puVar7;
      *target = 'P';
      if ((ulong)(long)(int)uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        target = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        uVar8 = (ulong)(long)(int)uVar10 >> 7;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)uVar8;
          target = target + 3;
        }
        else {
          target = target + 3;
          do {
            puVar12 = target;
            puVar12[-1] = (byte)uVar8 | 0x80;
            uVar9 = uVar8 >> 7;
            target = puVar12 + 1;
            bVar5 = 0x3fff < uVar8;
            uVar8 = uVar9;
          } while (bVar5);
          *puVar12 = (uint8)uVar9;
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  iVar2 = (this->weak_dependency_).current_size_;
  if (0 < iVar2) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      puVar7 = (uint *)RepeatedField<int>::Get(&this->weak_dependency_,iVar11);
      uVar10 = *puVar7;
      *target = 'X';
      if ((ulong)(long)(int)uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        target = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        uVar8 = (ulong)(long)(int)uVar10 >> 7;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)uVar8;
          target = target + 3;
        }
        else {
          target = target + 3;
          do {
            puVar12 = target;
            puVar12[-1] = (byte)uVar8 | 0x80;
            uVar9 = uVar8 >> 7;
            target = puVar12 + 1;
            bVar5 = 0x3fff < uVar8;
            uVar8 = uVar9;
          } while (bVar5);
          *puVar12 = (uint8)uVar9;
        }
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar2);
  }
  if ((uVar1 & 4) != 0) {
    psVar3 = (this->syntax_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.FileDescriptorProto.syntax");
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xc,(this->syntax_).ptr_,target);
  }
  pvVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) != 0) {
    puVar12 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)(((ulong)pvVar4 & 0xfffffffffffffffe) + 8),target,stream
                        );
    return puVar12;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FileDescriptorProto::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FileDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string package = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_package().data(), static_cast<int>(this->_internal_package().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.package");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_package(), target);
  }

  // repeated string dependency = 3;
  for (int i = 0, n = this->_internal_dependency_size(); i < n; i++) {
    const auto& s = this->_internal_dependency(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.dependency");
    target = stream->WriteString(3, s, target);
  }

  // repeated .google.protobuf.DescriptorProto message_type = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_message_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_message_type(i), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 5;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_enum_type_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(5, this->_internal_enum_type(i), target, stream);
  }

  // repeated .google.protobuf.ServiceDescriptorProto service = 6;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_service_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(6, this->_internal_service(i), target, stream);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 7;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_extension_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(7, this->_internal_extension(i), target, stream);
  }

  // optional .google.protobuf.FileOptions options = 8;
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        8, _Internal::options(this), target, stream);
  }

  // optional .google.protobuf.SourceCodeInfo source_code_info = 9;
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        9, _Internal::source_code_info(this), target, stream);
  }

  // repeated int32 public_dependency = 10;
  for (int i = 0, n = this->_internal_public_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(10, this->_internal_public_dependency(i), target);
  }

  // repeated int32 weak_dependency = 11;
  for (int i = 0, n = this->_internal_weak_dependency_size(); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(11, this->_internal_weak_dependency(i), target);
  }

  // optional string syntax = 12;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_syntax().data(), static_cast<int>(this->_internal_syntax().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileDescriptorProto.syntax");
    target = stream->WriteStringMaybeAliased(
        12, this->_internal_syntax(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FileDescriptorProto)
  return target;
}